

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall
MeasurementToString_caseSensitive_Test::TestBody(MeasurementToString_caseSensitive_Test *this)

{
  initializer_list<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  uint64_t uVar6;
  Message *pMVar7;
  char *pcVar8;
  precise_measurement *measure;
  code *match_flags;
  char *in_R9;
  precise_unit pVar9;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_618;
  string local_5f8;
  AssertHelper local_5d8;
  Message local_5d0;
  precise_unit local_5c8;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_580 [8];
  precise_measurement round_trip;
  string case_insensitive_plural_str;
  AssertHelper local_528;
  Message local_520;
  precise_unit local_518;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_4d0 [8];
  precise_measurement case_insensitive_singular_caps;
  AssertHelper local_498;
  Message local_490;
  precise_unit local_488;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_440 [8];
  precise_measurement case_insensitive_plural_caps;
  AssertHelper local_408;
  Message local_400;
  precise_unit local_3f8;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_3b0 [8];
  precise_measurement case_insensitive_singular;
  AssertHelper local_378;
  Message local_370;
  precise_unit local_368;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_320 [8];
  precise_measurement case_insensitive_plural;
  AssertHelper local_2e8;
  Message local_2e0;
  precise_unit local_2d8;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_290 [8];
  precise_measurement case_sensitive_singular;
  AssertHelper local_258;
  Message local_250;
  precise_unit local_248;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_;
  undefined1 local_200 [8];
  precise_measurement case_sensitive_plural;
  string local_1c8 [8];
  string plural_caps;
  string local_188 [8];
  string singular_caps;
  string plural;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string singular;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *up;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined1 local_20 [24];
  MeasurementToString_caseSensitive_Test *this_local;
  
  local_20._16_8_ = this;
  if ((TestBody()::twoc_units_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::twoc_units_abi_cxx11_), iVar2 != 0)) {
    local_c8 = &local_c0;
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(local_c8,(unit *)&units::lb,(char (*) [3])0x1d7fbe);
    local_c8 = &local_98;
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(local_c8,(unit *)&units::oz,(char (*) [3])0x1d7a46);
    local_c8 = &local_70;
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(local_c8,(unit *)&units::yd,(char (*) [3])0x1d6864);
    local_c8 = &local_48;
    register0x00000000 = units::unit_cast((precise_unit *)units::precise::us::quart);
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<units::unit,_const_char_(&)[3],_true>
              (&local_48,(unit *)((long)&__range1 + 4),(char (*) [3])0x1d81e0);
    local_20._0_8_ = &local_c0;
    local_20._8_8_ = 4;
    std::
    allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&__range1 + 3));
    __l._M_len = local_20._8_8_;
    __l._M_array = (iterator)local_20._0_8_;
    std::
    vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&TestBody()::twoc_units_abi_cxx11_,__l,
             (allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&__range1 + 3));
    std::
    allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&__range1 + 3));
    local_618 = (pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_20;
    do {
      local_618 = local_618 + -1;
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_618);
    } while (local_618 != &local_c0);
    __cxa_atexit(std::
                 vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~vector,&TestBody()::twoc_units_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::twoc_units_abi_cxx11_);
  }
  __end1 = std::
           vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&TestBody()::twoc_units_abi_cxx11_);
  up = (pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(&TestBody()::twoc_units_abi_cxx11_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&up);
    if (!bVar1) break;
    singular.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_140,"17 ",(allocator *)(plural.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (singular.field_2._8_8_ + 8));
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)(plural.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string
              ((string *)(singular_caps.field_2._M_local_buf + 8),(string *)local_120);
    std::__cxx11::string::push_back((char)&singular_caps + '\x18');
    std::__cxx11::string::string(local_188,(string *)local_120);
    _Var3._M_current = (char *)std::__cxx11::string::begin();
    _Var4._M_current = (char *)std::__cxx11::string::end();
    _Var5._M_current = (char *)std::__cxx11::string::begin();
    plural_caps.field_2._8_8_ =
         std::
         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                   (_Var3,_Var4,_Var5,toupper);
    std::__cxx11::string::string(local_1c8,(string *)(singular_caps.field_2._M_local_buf + 8));
    _Var3._M_current = (char *)std::__cxx11::string::begin();
    _Var4._M_current = (char *)std::__cxx11::string::end();
    _Var5._M_current = (char *)std::__cxx11::string::begin();
    match_flags = toupper;
    case_sensitive_plural.units_._8_8_ =
         std::
         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                   (_Var3,_Var4,_Var5,toupper);
    std::__cxx11::string::string
              ((string *)&gtest_ar_.message_,(string *)(singular_caps.field_2._M_local_buf + 8));
    uVar6 = units::getDefaultFlags();
    units::measurement_from_string
              ((precise_measurement *)local_200,(string *)&gtest_ar_.message_,uVar6);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_200);
    local_248 = pVar9;
    local_231 = units::precise_unit::has_same_base(&local_248,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_230,&local_231,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pMVar7 = testing::Message::operator<<(&local_250,(char (*) [12])"error with ");
      pMVar7 = testing::Message::operator<<
                         (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(singular.field_2._8_8_ + 8));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&case_sensitive_singular.units_.base_units_,(internal *)local_230,
                 (AssertionResult *)"case_sensitive_plural.units().has_same_base(up.first)","false",
                 "true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xa3;
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xa3,pcVar8);
      testing::internal::AssertHelper::operator=(&local_258,pMVar7);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      std::__cxx11::string::~string((string *)&case_sensitive_singular.units_.base_units_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    std::__cxx11::string::string((string *)&gtest_ar__1.message_,(string *)local_120);
    uVar6 = units::getDefaultFlags();
    units::measurement_from_string
              ((precise_measurement *)local_290,(string *)&gtest_ar__1.message_,uVar6);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_290);
    local_2d8 = pVar9;
    local_2c1 = units::precise_unit::has_same_base(&local_2d8,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&case_insensitive_plural.units_.base_units_,(internal *)local_2c0,
                 (AssertionResult *)"case_sensitive_singular.units().has_same_base(up.first)",
                 "false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xa7;
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xa7,pcVar8);
      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      std::__cxx11::string::~string((string *)&case_insensitive_plural.units_.base_units_);
      testing::Message::~Message(&local_2e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    std::__cxx11::string::string
              ((string *)&gtest_ar__2.message_,(string *)(singular_caps.field_2._M_local_buf + 8));
    units::measurement_from_string
              ((precise_measurement *)local_320,(string *)&gtest_ar__2.message_,0x200);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_320);
    local_368 = pVar9;
    local_351 = units::precise_unit::has_same_base(&local_368,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_350,&local_351,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
    if (!bVar1) {
      testing::Message::Message(&local_370);
      pMVar7 = testing::Message::operator<<
                         (&local_370,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (singular.field_2._8_8_ + 8));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&case_insensitive_singular.units_.base_units_,(internal *)local_350,
                 (AssertionResult *)"case_insensitive_plural.units().has_same_base(up.first)",
                 "false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xad;
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xad,pcVar8);
      testing::internal::AssertHelper::operator=(&local_378,pMVar7);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      std::__cxx11::string::~string((string *)&case_insensitive_singular.units_.base_units_);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
    std::__cxx11::string::string((string *)&gtest_ar__3.message_,(string *)local_120);
    units::measurement_from_string
              ((precise_measurement *)local_3b0,(string *)&gtest_ar__3.message_,0x200);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_3b0);
    local_3f8 = pVar9;
    local_3e1 = units::precise_unit::has_same_base(&local_3f8,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_400);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&case_insensitive_plural_caps.units_.base_units_,(internal *)local_3e0,
                 (AssertionResult *)"case_insensitive_singular.units().has_same_base(up.first)",
                 "false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xb3;
      testing::internal::AssertHelper::AssertHelper
                (&local_408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xb3,pcVar8);
      testing::internal::AssertHelper::operator=(&local_408,&local_400);
      testing::internal::AssertHelper::~AssertHelper(&local_408);
      std::__cxx11::string::~string((string *)&case_insensitive_plural_caps.units_.base_units_);
      testing::Message::~Message(&local_400);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    std::__cxx11::string::string((string *)&gtest_ar__4.message_,local_1c8);
    units::measurement_from_string
              ((precise_measurement *)local_440,(string *)&gtest_ar__4.message_,0x200);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_440);
    local_488 = pVar9;
    local_471 = units::precise_unit::has_same_base(&local_488,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_470,&local_471,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
    if (!bVar1) {
      testing::Message::Message(&local_490);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&case_insensitive_singular_caps.units_.base_units_,(internal *)local_470,
                 (AssertionResult *)"case_insensitive_plural_caps.units().has_same_base(up.first)",
                 "false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xba;
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xba,pcVar8);
      testing::internal::AssertHelper::operator=(&local_498,&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      std::__cxx11::string::~string((string *)&case_insensitive_singular_caps.units_.base_units_);
      testing::Message::~Message(&local_490);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
    std::__cxx11::string::string((string *)&gtest_ar__5.message_,local_188);
    units::measurement_from_string
              ((precise_measurement *)local_4d0,(string *)&gtest_ar__5.message_,0x200);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_4d0);
    local_518 = pVar9;
    local_501 = units::precise_unit::has_same_base(&local_518,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_500,&local_501,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar1) {
      testing::Message::Message(&local_520);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)((long)&case_insensitive_plural_str.field_2 + 8),(internal *)local_500,
                 (AssertionResult *)"case_insensitive_singular_caps.units().has_same_base(up.first)"
                 ,"false","true",in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      match_flags = (code *)0xc0;
      testing::internal::AssertHelper::AssertHelper
                (&local_528,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,0xc0,pcVar8);
      testing::internal::AssertHelper::operator=(&local_528,&local_520);
      testing::internal::AssertHelper::~AssertHelper(&local_528);
      std::__cxx11::string::~string
                ((string *)(case_insensitive_plural_str.field_2._M_local_buf + 8));
      testing::Message::~Message(&local_520);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    measure = (precise_measurement *)units::getDefaultFlags();
    units::to_string_abi_cxx11_
              ((string *)&round_trip.units_.base_units_,(units *)local_320,measure,
               (uint64_t)match_flags);
    std::__cxx11::string::string
              ((string *)&gtest_ar__6.message_,(string *)&round_trip.units_.base_units_);
    units::measurement_from_string
              ((precise_measurement *)local_580,(string *)&gtest_ar__6.message_,0x200);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    pVar9 = units::precise_measurement::units((precise_measurement *)local_580);
    local_5c8 = pVar9;
    local_5b1 = units::precise_unit::has_same_base(&local_5c8,(unit *)singular.field_2._8_8_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
    if (!bVar1) {
      testing::Message::Message(&local_5d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5f8,(internal *)local_5b0,
                 (AssertionResult *)"round_trip.units().has_same_base(up.first)","false","true",
                 in_R9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                 ,199,pcVar8);
      testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_5d8);
      std::__cxx11::string::~string((string *)&local_5f8);
      testing::Message::~Message(&local_5d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
    std::__cxx11::string::~string((string *)&round_trip.units_.base_units_);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string((string *)(singular_caps.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_120);
    __gnu_cxx::
    __normal_iterator<const_std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

TEST(MeasurementToString, caseSensitive)
{
    static const std::vector<std::pair<unit, std::string>> twoc_units{
        {lb, "lb"},
        {oz, "oz"},
        {yd, "yd"},
        {unit_cast(precise::us::quart), "qt"}};

    for (const auto& up : twoc_units) {
        std::string singular = std::string("17 ") + up.second;
        std::string plural = singular;
        plural.push_back('s');

        std::string singular_caps = singular;
        std::transform(
            singular.begin(), singular.end(), singular_caps.begin(), ::toupper);

        std::string plural_caps = plural;
        std::transform(
            plural.begin(), plural.end(), plural_caps.begin(), ::toupper);

        precise_measurement case_sensitive_plural =
            measurement_from_string(plural);
        // true
        EXPECT_TRUE(case_sensitive_plural.units().has_same_base(up.first))
            << "error with " << up.second;
        precise_measurement case_sensitive_singular =
            measurement_from_string(singular);
        EXPECT_TRUE(case_sensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion
        precise_measurement case_insensitive_plural =
            measurement_from_string(plural, case_insensitive);
        // true
        EXPECT_TRUE(case_insensitive_plural.units().has_same_base(up.first))
            << up.second;

        units::precise_measurement case_insensitive_singular =
            measurement_from_string(singular, case_insensitive);
        // false
        EXPECT_TRUE(case_insensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion caps
        precise_measurement case_insensitive_plural_caps =
            measurement_from_string(plural_caps, case_insensitive);
        // true
        EXPECT_TRUE(
            case_insensitive_plural_caps.units().has_same_base(up.first));

        units::precise_measurement case_insensitive_singular_caps =
            measurement_from_string(singular_caps, case_insensitive);
        // false
        EXPECT_TRUE(
            case_insensitive_singular_caps.units().has_same_base(up.first));

        // Round trip
        const std::string case_insensitive_plural_str =
            units::to_string(case_insensitive_plural);
        units::precise_measurement round_trip = units::measurement_from_string(
            case_insensitive_plural_str, units::case_insensitive);
        EXPECT_TRUE(round_trip.units().has_same_base(up.first));
    }
}